

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_shared.h
# Opt level: O0

Element_conflict
Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
::_multiply(Element_conflict a,Element_conflict b)

{
  Element_conflict local_18;
  Element_conflict local_14;
  Element_conflict temp_b;
  Element_conflict res;
  Element_conflict b_local;
  Element_conflict a_local;
  
  local_14 = 0;
  temp_b = b;
  res = a;
  if (b < a) {
    std::swap<unsigned_int>(&res,&temp_b);
  }
  while (res != 0) {
    if ((res & 1) != 0) {
      if (productOfAllCharacteristics_ - local_14 <= temp_b) {
        local_14 = local_14 - productOfAllCharacteristics_;
      }
      local_14 = temp_b + local_14;
    }
    res = res >> 1;
    local_18 = temp_b;
    if (productOfAllCharacteristics_ - temp_b <= temp_b) {
      local_18 = temp_b - productOfAllCharacteristics_;
    }
    temp_b = local_18 + temp_b;
  }
  return local_14;
}

Assistant:

static Element _multiply(Element a, Element b) {
    Element res = 0;
    Element temp_b = 0;

    if (b < a) std::swap(a, b);

    while (a != 0) {
      if (a & 1) {
        /* Add b to res, modulo m, without overflow */
        if (b >= productOfAllCharacteristics_ - res) res -= productOfAllCharacteristics_;
        res += b;
      }
      a >>= 1;

      /* Double b, modulo m */
      temp_b = b;
      if (b >= productOfAllCharacteristics_ - b) temp_b -= productOfAllCharacteristics_;
      b += temp_b;
    }
    return res;
  }